

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O1

int ON_UuidIndex::CompareIdAndIndex(ON_UuidIndex *a,ON_UuidIndex *b)

{
  uint uVar1;
  
  if (a == (ON_UuidIndex *)0x0) {
    uVar1 = -(uint)(b != (ON_UuidIndex *)0x0);
  }
  else if (b == (ON_UuidIndex *)0x0) {
    uVar1 = 1;
  }
  else {
    uVar1 = ON_UuidCompare(&a->m_id,&b->m_id);
    if (uVar1 == 0) {
      uVar1 = 0xffffffff;
      if (b->m_i <= a->m_i) {
        uVar1 = (uint)(b->m_i < a->m_i);
      }
    }
  }
  return uVar1;
}

Assistant:

int ON_UuidIndex::CompareIdAndIndex( const ON_UuidIndex* a, const ON_UuidIndex* b )
{
  int i;
  if ( !a )
    return (b ? -1 : 0 );
  if ( !b )
    return 1;

  // compare id first
  if (0 == (i = ON_UuidCompare(&a->m_id, &b->m_id)))
  {
    if (a->m_i < b->m_i)
      i = -1;
    else if (a->m_i > b->m_i)
      i = 1;
  }

  return i;
}